

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Objects.c
# Opt level: O0

void Vector_printRange(Vector *vector,uint min,uint max)

{
  uint local_1c;
  uint i;
  uint max_local;
  uint min_local;
  Vector *vector_local;
  
  if (((min <= max) && (vector != (Vector *)0x0)) && (max < vector->size)) {
    printf("Array = { ");
    for (local_1c = min; local_1c <= max; local_1c = local_1c + 1) {
      printf("%3d",(ulong)(uint)vector->a[local_1c]);
    }
    printf(" }\n");
  }
  return;
}

Assistant:

void Vector_printRange(Vector* vector, unsigned int min, unsigned int max) {
    unsigned int i;
    if (min > max || vector == NULL || max >= vector->size)
        return;

    printf("Array = { ");
    for (i = min; i <= max; ++i) {
        printf("%3d", vector->a[i]);
    }
    printf(" }\n");
}